

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_common.c
# Opt level: O2

LY_ERR lysp_stmt_type(lysp_ctx *ctx,lysp_stmt *stmt,lysp_type *type)

{
  lysp_ext_instance **exts;
  uint16_t *flags;
  uint8_t *puVar1;
  lysp_stmt *stmt_00;
  lysp_type *plVar2;
  LY_ERR LVar3;
  long *plVar4;
  lysp_restr *plVar5;
  ushort uVar6;
  long lVar7;
  ly_stmt lVar8;
  ly_ctx *plVar9;
  lysp_ext_instance **in_R8;
  char *pcVar10;
  lysp_ext_instance **in_R9;
  lysp_stmt **pplVar11;
  LY_ERR ret__;
  char *str_path;
  lyxp_expr **local_68;
  char ***local_60;
  lysp_type_enum **local_58;
  lysp_type_enum **local_50;
  uint8_t *local_48;
  lysp_restr **local_40;
  uint8_t *local_38;
  
  str_path = (char *)0x0;
  if (type->name != (char *)0x0) {
    if (ctx == (lysp_ctx *)0x0) {
      plVar9 = (ly_ctx *)0x0;
    }
    else {
      plVar9 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar10 = "type";
LAB_001699b3:
    ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".",pcVar10);
    return LY_EVALID;
  }
  LVar3 = lysp_stmt_validate_value(ctx,Y_PREF_IDENTIF_ARG,stmt->arg);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  if (ctx == (lysp_ctx *)0x0) {
    plVar9 = (ly_ctx *)0x0;
  }
  else {
    plVar9 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  LVar3 = lydict_insert(plVar9,stmt->arg,0,&type->name);
  if (LVar3 != LY_SUCCESS) {
    return LVar3;
  }
  type->pmod = (lysp_module *)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  pplVar11 = &stmt->child;
  exts = &type->exts;
  flags = &type->flags;
  local_38 = &type->require_instance;
  local_40 = &type->patterns;
  local_68 = &type->path;
  local_48 = &type->fraction_digits;
  local_50 = &type->enums;
  local_58 = &type->bits;
  local_60 = &type->bases;
  do {
    stmt_00 = *pplVar11;
    if (stmt_00 == (lysp_stmt *)0x0) {
      return LY_SUCCESS;
    }
    lVar8 = stmt_00->kw;
    if (lVar8 == LY_STMT_TYPE) {
      plVar2 = type->types;
      if (plVar2 == (lysp_type *)0x0) {
        plVar4 = (long *)malloc(0x70);
        if (plVar4 != (long *)0x0) {
          *plVar4 = 1;
          lVar7 = 1;
          goto LAB_00169caf;
        }
      }
      else {
        lVar7 = *(long *)&plVar2[-1].fraction_digits;
        *(long *)&plVar2[-1].fraction_digits = lVar7 + 1;
        plVar4 = (long *)realloc(&plVar2[-1].fraction_digits,lVar7 * 0x68 + 0x70);
        if (plVar4 != (long *)0x0) {
          lVar7 = *plVar4;
LAB_00169caf:
          type->types = (lysp_type *)(plVar4 + 1);
          plVar4 = plVar4 + lVar7 * 0xd;
          plVar4[-2] = 0;
          plVar4[-1] = 0;
          plVar4[-4] = 0;
          plVar4[-3] = 0;
          plVar4[-6] = 0;
          plVar4[-5] = 0;
          plVar4[-8] = 0;
          plVar4[-7] = 0;
          plVar4[-10] = 0;
          plVar4[-9] = 0;
          ((lysp_type *)(plVar4 + -0xc))->name = (char *)0x0;
          plVar4[-0xb] = 0;
          *plVar4 = 0;
          LVar3 = lysp_stmt_type(ctx,stmt_00,(lysp_type *)(plVar4 + -0xc));
          uVar6 = 0x100;
          goto LAB_00169cf1;
        }
        puVar1 = &type->types[-1].fraction_digits;
        *(long *)puVar1 = *(long *)puVar1 + -1;
      }
LAB_00169e12:
      if (ctx == (lysp_ctx *)0x0) {
        plVar9 = (ly_ctx *)0x0;
      }
      else {
        plVar9 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
LAB_00169ead:
      ly_log(plVar9,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_stmt_type");
      return LY_EMEM;
    }
    if (lVar8 == LY_STMT_BIT) {
      LVar3 = lysp_stmt_type_enum(ctx,stmt_00,local_58);
      uVar6 = 2;
LAB_00169cf1:
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
LAB_00169cf9:
      *flags = *flags | uVar6;
    }
    else {
      if (lVar8 == LY_STMT_ENUM) {
        LVar3 = lysp_stmt_type_enum(ctx,stmt_00,local_50);
        uVar6 = 4;
        goto LAB_00169cf1;
      }
      if (lVar8 != LY_STMT_EXTENSION_INSTANCE) {
        if (lVar8 == LY_STMT_FRACTION_DIGITS) {
          LVar3 = lysp_stmt_type_fracdigits(ctx,stmt_00,local_48,exts);
          uVar6 = 8;
          goto LAB_00169cf1;
        }
        if (lVar8 != LY_STMT_LENGTH) {
          if (lVar8 != LY_STMT_PATH) {
            if (lVar8 == LY_STMT_PATTERN) {
              LVar3 = lysp_stmt_type_pattern(ctx,stmt_00,local_40);
              uVar6 = 0x40;
            }
            else if (lVar8 == LY_STMT_RANGE) {
              if (type->range != (lysp_restr *)0x0) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar9 = (ly_ctx *)0x0;
                }
                else {
                  plVar9 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                lVar8 = LY_STMT_RANGE;
                goto LAB_00169e81;
              }
              plVar5 = (lysp_restr *)calloc(1,0x40);
              type->range = plVar5;
              if (plVar5 == (lysp_restr *)0x0) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar9 = (ly_ctx *)0x0;
                }
                else {
                  plVar9 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                goto LAB_00169ead;
              }
              LVar3 = lysp_stmt_restr(ctx,stmt_00,plVar5);
              uVar6 = 0x80;
            }
            else {
              if (lVar8 == LY_STMT_REQUIRE_INSTANCE) {
                in_R8 = exts;
                LVar3 = lysp_stmt_type_reqinstance(ctx,stmt_00,local_38,flags,exts);
                goto LAB_00169c01;
              }
              if (lVar8 != LY_STMT_BASE) {
                if (ctx == (lysp_ctx *)0x0) {
                  plVar9 = (ly_ctx *)0x0;
                }
                else {
                  plVar9 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar10 = lyplg_ext_stmt2str(lVar8);
                ly_vlog(plVar9,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar10,"type");
                return LY_EVALID;
              }
              LVar3 = lysp_stmt_text_fields(ctx,stmt_00,local_60,(yang_arg)exts,in_R8);
              uVar6 = 1;
            }
            goto LAB_00169cf1;
          }
          LVar3 = lysp_stmt_text_field
                            (ctx,stmt_00,(uint32_t)&str_path,(char **)0x2,(yang_arg)exts,in_R9);
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          if (ctx == (lysp_ctx *)0x0) {
            plVar9 = (ly_ctx *)0x0;
          }
          else {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          in_R8 = (lysp_ext_instance **)0x1;
          in_R9 = (lysp_ext_instance **)0x2;
          LVar3 = ly_path_parse(plVar9,(lysc_node *)0x0,str_path,0,'\x01',2,0x10,0x400,local_68);
          plVar9 = (ly_ctx *)0x0;
          if (ctx != (lysp_ctx *)0x0) {
            plVar9 = (ly_ctx *)
                     **(undefined8 **)
                       (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
          }
          lydict_remove(plVar9,str_path);
          uVar6 = 0x20;
          if (LVar3 != LY_SUCCESS) {
            return LVar3;
          }
          goto LAB_00169cf9;
        }
        if (type->length == (lysp_restr *)0x0) {
          plVar5 = (lysp_restr *)calloc(1,0x40);
          type->length = plVar5;
          if (plVar5 == (lysp_restr *)0x0) goto LAB_00169e12;
          LVar3 = lysp_stmt_restr(ctx,stmt_00,plVar5);
          uVar6 = 0x10;
          goto LAB_00169cf1;
        }
        if (ctx == (lysp_ctx *)0x0) {
          plVar9 = (ly_ctx *)0x0;
        }
        else {
          plVar9 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        lVar8 = LY_STMT_LENGTH;
LAB_00169e81:
        pcVar10 = lyplg_ext_stmt2str(lVar8);
        goto LAB_001699b3;
      }
      in_R8 = exts;
      LVar3 = lysp_stmt_ext(ctx,stmt_00,LY_STMT_TYPE,0,exts);
LAB_00169c01:
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    pplVar11 = &stmt_00->next;
  } while( true );
}

Assistant:

static LY_ERR
lysp_stmt_type(struct lysp_ctx *ctx, const struct lysp_stmt *stmt, struct lysp_type *type)
{
    struct lysp_type *nest_type;
    const char *str_path = NULL;
    LY_ERR ret;

    if (type->name) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "type");
        return LY_EVALID;
    }

    LY_CHECK_RET(lysp_stmt_validate_value(ctx, Y_PREF_IDENTIF_ARG, stmt->arg));
    LY_CHECK_RET(lydict_insert(PARSER_CTX(ctx), stmt->arg, 0, &type->name));
    type->pmod = PARSER_CUR_PMOD(ctx);

    for (const struct lysp_stmt *child = stmt->child; child; child = child->next) {
        switch (child->kw) {
        case LY_STMT_BASE:
            LY_CHECK_RET(lysp_stmt_text_fields(ctx, child, &type->bases, Y_PREF_IDENTIF_ARG, &type->exts));
            type->flags |= LYS_SET_BASE;
            break;
        case LY_STMT_BIT:
            LY_CHECK_RET(lysp_stmt_type_enum(ctx, child, &type->bits));
            type->flags |= LYS_SET_BIT;
            break;
        case LY_STMT_ENUM:
            LY_CHECK_RET(lysp_stmt_type_enum(ctx, child, &type->enums));
            type->flags |= LYS_SET_ENUM;
            break;
        case LY_STMT_FRACTION_DIGITS:
            LY_CHECK_RET(lysp_stmt_type_fracdigits(ctx, child, &type->fraction_digits, &type->exts));
            type->flags |= LYS_SET_FRDIGITS;
            break;
        case LY_STMT_LENGTH:
            if (type->length) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(child->kw));
                return LY_EVALID;
            }
            type->length = calloc(1, sizeof *type->length);
            LY_CHECK_ERR_RET(!type->length, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(lysp_stmt_restr(ctx, child, type->length));
            type->flags |= LYS_SET_LENGTH;
            break;
        case LY_STMT_PATH:
            LY_CHECK_RET(lysp_stmt_text_field(ctx, child, 0, &str_path, Y_STR_ARG, &type->exts));
            ret = ly_path_parse(PARSER_CTX(ctx), NULL, str_path, 0, 1, LY_PATH_BEGIN_EITHER,
                    LY_PATH_PREFIX_OPTIONAL, LY_PATH_PRED_LEAFREF, &type->path);
            lydict_remove(PARSER_CTX(ctx), str_path);
            LY_CHECK_RET(ret);
            type->flags |= LYS_SET_PATH;
            break;
        case LY_STMT_PATTERN:
            LY_CHECK_RET(lysp_stmt_type_pattern(ctx, child, &type->patterns));
            type->flags |= LYS_SET_PATTERN;
            break;
        case LY_STMT_RANGE:
            if (type->range) {
                LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, lyplg_ext_stmt2str(child->kw));
                return LY_EVALID;
            }
            type->range = calloc(1, sizeof *type->range);
            LY_CHECK_ERR_RET(!type->range, LOGMEM(PARSER_CTX(ctx)), LY_EMEM);

            LY_CHECK_RET(lysp_stmt_restr(ctx, child, type->range));
            type->flags |= LYS_SET_RANGE;
            break;
        case LY_STMT_REQUIRE_INSTANCE:
            LY_CHECK_RET(lysp_stmt_type_reqinstance(ctx, child, &type->require_instance, &type->flags, &type->exts));
            /* LYS_SET_REQINST checked and set inside lysp_stmt_type_reqinstance() */
            break;
        case LY_STMT_TYPE:
            LY_ARRAY_NEW_RET(PARSER_CTX(ctx), type->types, nest_type, LY_EMEM);
            LY_CHECK_RET(lysp_stmt_type(ctx, child, nest_type));
            type->flags |= LYS_SET_TYPE;
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(lysp_stmt_ext(ctx, child, LY_STMT_TYPE, 0, &type->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(child->kw), "type");
            return LY_EVALID;
        }
    }
    return LY_SUCCESS;
}